

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalVector.hpp
# Opt level: O0

void __thiscall
limonp::LocalVector<cppjieba::RuneStr>::reserve(LocalVector<cppjieba::RuneStr> *this,size_t size)

{
  void *__src;
  void *pvVar1;
  ulong in_RSI;
  void *in_RDI;
  RuneStr *old;
  RuneStr *next;
  
  if (*(ulong *)((long)in_RDI + 0x150) < in_RSI) {
    pvVar1 = malloc(in_RSI * 0x14);
    if (pvVar1 == (void *)0x0) {
      __assert_fail("next",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/messense[P]cppjieba-cabi/cppjieba/deps/limonp/LocalVector.hpp"
                    ,0x5c,
                    "void limonp::LocalVector<cppjieba::RuneStr>::reserve(size_t) [T = cppjieba::RuneStr]"
                   );
    }
    __src = *(void **)((long)in_RDI + 0x140);
    *(void **)((long)in_RDI + 0x140) = pvVar1;
    memcpy(*(void **)((long)in_RDI + 0x140),__src,*(long *)((long)in_RDI + 0x150) * 0x14);
    *(ulong *)((long)in_RDI + 0x150) = in_RSI;
    if (__src != in_RDI) {
      free(__src);
    }
  }
  return;
}

Assistant:

void reserve(size_t size) {
    if(size <= capacity_) {
      return;
    }
    T * next =  (T*)malloc(sizeof(T) * size);
    assert(next);
    T * old = ptr_;
    ptr_ = next;
    memcpy(ptr_, old, sizeof(T) * capacity_);
    capacity_ = size;
    if(old != buffer_) {
      free(old);
    }
  }